

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

JSON_Status json_array_clear(JSON_Array *array)

{
  JSON_Value *value;
  ulong uVar1;
  
  if (array != (JSON_Array *)0x0) {
    if (array->count != 0) {
      uVar1 = 0;
      do {
        if (uVar1 < array->count) {
          value = array->items[uVar1];
        }
        else {
          value = (JSON_Value *)0x0;
        }
        json_value_free(value);
        uVar1 = uVar1 + 1;
      } while (uVar1 < array->count);
    }
    array->count = 0;
    return 0;
  }
  return -1;
}

Assistant:

JSON_Status json_array_clear(JSON_Array *array) {
    size_t i = 0;
    if (array == NULL) {
        return JSONFailure;
    }
    for (i = 0; i < json_array_get_count(array); i++) {
        json_value_free(json_array_get_value(array, i));
    }
    array->count = 0;
    return JSONSuccess;
}